

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

bool __thiscall
llvm::
DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
::LookupBucketFor<unsigned_long>
          (DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
           *this,unsigned_long *Val,DenseMapPair<unsigned_long,_unsigned_long> **FoundBucket)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  long lVar4;
  uint uVar5;
  DenseMapPair<unsigned_long,_unsigned_long> *pDVar6;
  int iVar7;
  DenseMapPair<unsigned_long,_unsigned_long> *pDVar8;
  
  if (*(int *)(this + 0x10) == 0) {
    pDVar8 = (DenseMapPair<unsigned_long,_unsigned_long> *)0x0;
LAB_00dad3af:
    bVar3 = false;
  }
  else {
    uVar1 = *Val;
    if (0xfffffffffffffffd < uVar1) {
      __assert_fail("!KeyInfoT::isEqual(Val, EmptyKey) && !KeyInfoT::isEqual(Val, TombstoneKey) && \"Empty/Tombstone value shouldn\'t be inserted into map!\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/DenseMap.h"
                    ,0x252,
                    "bool llvm::DenseMapBase<llvm::DenseMap<unsigned long, unsigned long>, unsigned long, unsigned long, llvm::DenseMapInfo<unsigned long>, llvm::detail::DenseMapPair<unsigned long, unsigned long>>::LookupBucketFor(const LookupKeyT &, const BucketT *&) const [DerivedT = llvm::DenseMap<unsigned long, unsigned long>, KeyT = unsigned long, ValueT = unsigned long, KeyInfoT = llvm::DenseMapInfo<unsigned long>, BucketT = llvm::detail::DenseMapPair<unsigned long, unsigned long>, LookupKeyT = unsigned long]"
                   );
    }
    uVar5 = (int)uVar1 * 0x25;
    iVar7 = 1;
    pDVar6 = (DenseMapPair<unsigned_long,_unsigned_long> *)0x0;
    while( true ) {
      uVar5 = uVar5 & *(int *)(this + 0x10) - 1U;
      lVar4 = (ulong)uVar5 * 0x10;
      pDVar8 = (DenseMapPair<unsigned_long,_unsigned_long> *)(*(long *)this + lVar4);
      uVar2 = *(ulong *)(*(long *)this + lVar4);
      bVar3 = true;
      if (uVar1 == uVar2) break;
      if (uVar2 == 0xffffffffffffffff) {
        if (pDVar6 != (DenseMapPair<unsigned_long,_unsigned_long> *)0x0) {
          pDVar8 = pDVar6;
        }
        goto LAB_00dad3af;
      }
      if (uVar2 == 0xfffffffffffffffe && pDVar6 == (DenseMapPair<unsigned_long,_unsigned_long> *)0x0
         ) {
        pDVar6 = pDVar8;
      }
      uVar5 = uVar5 + iVar7;
      iVar7 = iVar7 + 1;
    }
  }
  *FoundBucket = pDVar8;
  return bVar3;
}

Assistant:

bool LookupBucketFor(const LookupKeyT &Val,
                       const BucketT *&FoundBucket) const {
    const BucketT *BucketsPtr = getBuckets();
    const unsigned NumBuckets = getNumBuckets();

    if (NumBuckets == 0) {
      FoundBucket = nullptr;
      return false;
    }

    // FoundTombstone - Keep track of whether we find a tombstone while probing.
    const BucketT *FoundTombstone = nullptr;
    const KeyT EmptyKey = getEmptyKey();
    const KeyT TombstoneKey = getTombstoneKey();
    assert(!KeyInfoT::isEqual(Val, EmptyKey) &&
           !KeyInfoT::isEqual(Val, TombstoneKey) &&
           "Empty/Tombstone value shouldn't be inserted into map!");

    unsigned BucketNo = getHashValue(Val) & (NumBuckets-1);
    unsigned ProbeAmt = 1;
    while (true) {
      const BucketT *ThisBucket = BucketsPtr + BucketNo;
      // Found Val's bucket?  If so, return it.
      if (LLVM_LIKELY(KeyInfoT::isEqual(Val, ThisBucket->getFirst()))) {
        FoundBucket = ThisBucket;
        return true;
      }

      // If we found an empty bucket, the key doesn't exist in the set.
      // Insert it and return the default value.
      if (LLVM_LIKELY(KeyInfoT::isEqual(ThisBucket->getFirst(), EmptyKey))) {
        // If we've already seen a tombstone while probing, fill it in instead
        // of the empty bucket we eventually probed to.
        FoundBucket = FoundTombstone ? FoundTombstone : ThisBucket;
        return false;
      }

      // If this is a tombstone, remember it.  If Val ends up not in the map, we
      // prefer to return it than something that would require more probing.
      if (KeyInfoT::isEqual(ThisBucket->getFirst(), TombstoneKey) &&
          !FoundTombstone)
        FoundTombstone = ThisBucket;  // Remember the first tombstone found.

      // Otherwise, it's a hash collision or a tombstone, continue quadratic
      // probing.
      BucketNo += ProbeAmt++;
      BucketNo &= (NumBuckets-1);
    }
  }